

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_JumpIfArmorType(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  AInventory *pAVar5;
  int iVar6;
  char *pcVar7;
  FState *state;
  void *val;
  bool bVar8;
  FName local_34;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (this->super_DThinker).super_DObject.Class;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00644ac0;
        }
      }
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar7 = "(paramnum) < numparam";
          }
          else {
            if ((param[2].field_0.field_3.Type == '\x03') &&
               ((iVar3 = param[1].field_0.i, param[2].field_0.field_1.atag == 7 ||
                (param[2].field_0.field_1.a == (void *)0x0)))) {
              val = param[2].field_0.field_1.a;
              iVar6 = 1;
              if (numparam != 3) {
                VVar1 = param[3].field_0.field_3.Type;
                if (VVar1 == '\0') {
                  iVar6 = param[3].field_0.i;
                }
                else if (VVar1 != 0xff) {
                  __assert_fail("param[paramnum].Type == REGT_INT",
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                                ,0x54e,
                                "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                               );
                }
              }
              local_34.Index = 0x5b;
              pAVar5 = AActor::FindInventory(this,&local_34);
              if (((pAVar5 == (AInventory *)0x0) ||
                  (*(int *)((long)&pAVar5[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4)
                   != iVar3)) || (pAVar5->Amount < iVar6)) {
                if (numret < 1) {
                  return 0;
                }
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                                ,0x556,
                                "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                               );
                }
                val = (void *)0x0;
              }
              else {
                if (numret < 1) {
                  return 0;
                }
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                                ,0x554,
                                "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                               );
                }
              }
              VMReturn::SetPointer(ret,val,7);
              return 1;
            }
            pcVar7 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
            ;
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x54d,
                        "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)")
          ;
        }
        pcVar7 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x54c,
                    "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00644ac0:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x54b,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfArmorType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME	 (type);
	PARAM_STATE	 (label);
	PARAM_INT_OPT(amount) { amount = 1; }

	ABasicArmor *armor = (ABasicArmor *)self->FindInventory(NAME_BasicArmor);

	if (armor && armor->ArmorType == type && armor->Amount >= amount)
	{
		ACTION_RETURN_STATE(label);
	}
	ACTION_RETURN_STATE(NULL);
}